

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O3

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapBoundFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  TTD_PTR_ID *pTVar1;
  code *pcVar2;
  TTD_PTR_ID TVar3;
  bool bVar4;
  BOOL BVar5;
  ScriptContext *pSVar6;
  RecyclableObject *pRVar7;
  Recycler *this;
  undefined4 *puVar8;
  Type *args;
  Var pvVar9;
  size_t size;
  Type *addr;
  uint ct;
  ulong uVar10;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  pSVar6 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag != SnapBoundFunctionObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  pTVar1 = (TTD_PTR_ID *)snpObject->AddtlSnapObjectInfo;
  data._32_8_ = InflateMap::LookupObject(inflator,*pTVar1);
  ct = 0;
  if (pTVar1[1] == 0) {
    pRVar7 = (RecyclableObject *)0x0;
  }
  else {
    pRVar7 = InflateMap::LookupObject(inflator,pTVar1[1]);
  }
  if ((ulong)(uint)pTVar1[2] == 0) {
    args = (Type *)0x0;
  }
  else {
    local_78 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4276212;
    data.filename._0_4_ = 0x3ac;
    data.plusSize = (ulong)(uint)pTVar1[2];
    this = Memory::Recycler::TrackAllocInfo(pSVar6->recycler,(TrackAllocData *)local_78);
    TVar3 = pTVar1[2];
    if ((ulong)(uint)TVar3 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
      args = (Type *)&DAT_00000008;
    }
    else {
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0090b447;
        *puVar8 = 0;
      }
      size = (ulong)(uint)TVar3 << 3;
      args = (Type *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                               (this,size);
      if (args == (Type *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_0090b447:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      memset(args,0,size);
    }
    if ((int)pTVar1[2] != 0) {
      uVar10 = 0;
      addr = args;
      do {
        pvVar9 = InflateMap::InflateTTDVar(inflator,*(TTDVar *)(pTVar1[3] + uVar10 * 8));
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pvVar9;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        uVar10 = uVar10 + 1;
        ct = (uint)pTVar1[2];
        addr = addr + 1;
      } while (uVar10 < ct);
    }
  }
  pRVar7 = Js::JavascriptLibrary::CreateBoundFunction_TTD
                     ((pSVar6->super_ScriptContextBase).javascriptLibrary,
                      (RecyclableObject *)data._32_8_,pRVar7,ct,args);
  return pRVar7;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapBoundFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Bound functions are not too common and have special internal state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapBoundFunctionInfo* snapBoundInfo = SnapObjectGetAddtlInfoAs<SnapBoundFunctionInfo*, SnapObjectType::SnapBoundFunctionObject>(snpObject);

            Js::RecyclableObject* bFunction = inflator->LookupObject(snapBoundInfo->TargetFunction);
            Js::RecyclableObject* bThis = (snapBoundInfo->BoundThis != TTD_INVALID_PTR_ID) ? inflator->LookupObject(snapBoundInfo->BoundThis) : nullptr;

            Field(Js::Var)* bArgs = nullptr;
            if(snapBoundInfo->ArgCount != 0)
            {
                bArgs = RecyclerNewArray(ctx->GetRecycler(), Field(Js::Var), snapBoundInfo->ArgCount);

                for(uint i = 0; i < snapBoundInfo->ArgCount; i++)
                {
                    bArgs[i] = inflator->InflateTTDVar(snapBoundInfo->ArgArray[i]);
                }
            }

            return ctx->GetLibrary()->CreateBoundFunction_TTD(bFunction, bThis, snapBoundInfo->ArgCount, bArgs);
        }